

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O1

void brotli::RunLengthCodeZeros
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v_in,
               uint32_t *max_run_length_prefix,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v_out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *extra_bits)

{
  iterator iVar1;
  long lVar2;
  ulong uVar3;
  pointer puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint32_t run_length_prefix;
  uint32_t max_prefix;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint32_t *local_38;
  
  puVar4 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar2 == 0) {
    uVar5 = 0;
  }
  else {
    uVar3 = lVar2 >> 2;
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar11 = uVar7 + 1;
      if (uVar7 + 1 < uVar3) {
        uVar11 = uVar3;
      }
      do {
        uVar8 = uVar7;
        if (puVar4[uVar7] == 0) break;
        uVar7 = uVar7 + 1;
        uVar8 = uVar11;
      } while (uVar11 != uVar7);
      uVar7 = uVar8;
      uVar10 = 0;
      if (uVar8 < uVar3) {
        iVar6 = (int)uVar8;
        uVar9 = 0;
        do {
          uVar7 = uVar8;
          uVar10 = uVar9;
          if (puVar4[uVar8] != 0) break;
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 + 1;
          uVar7 = uVar3;
          uVar10 = (int)uVar3 - iVar6;
        } while (uVar3 != uVar8);
      }
      if (uVar5 < uVar10) {
        uVar5 = uVar10;
      }
    } while (uVar7 < uVar3);
  }
  local_40 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> local_40 == 0; local_40 = local_40 - 1) {
    }
  }
  if (uVar5 == 0) {
    local_40 = 0;
  }
  if (*max_run_length_prefix < local_40) {
    local_40 = *max_run_length_prefix;
  }
  *max_run_length_prefix = local_40;
  puVar4 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar2 != 0) {
    uVar7 = lVar2 >> 2;
    uVar3 = 0;
    local_38 = max_run_length_prefix;
    do {
      if (puVar4[uVar3] == 0) {
        uVar5 = 1;
        if (uVar3 + 1 < uVar7) {
          uVar5 = (int)uVar7 - (int)uVar3;
          lVar2 = 1;
          do {
            if (puVar4[uVar3 + lVar2] != 0) {
              uVar5 = (uint)lVar2;
              break;
            }
            lVar2 = lVar2 + 1;
          } while (uVar7 - uVar3 != lVar2);
        }
        uVar3 = uVar3 + uVar5;
        if (uVar5 != 0) {
LAB_00179b6b:
          if ((uint)(2 << ((byte)local_40 & 0x1f)) <= uVar5) goto code_r0x00179b7a;
          local_44 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> local_44 == 0; local_44 = local_44 - 1) {
            }
          }
          iVar1._M_current =
               (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)v_out,iVar1,&local_44);
          }
          else {
            *iVar1._M_current = local_44;
            (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          local_3c = (-1 << ((byte)local_44 & 0x1f)) + uVar5;
          iVar1._M_current =
               (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(extra_bits,iVar1,&local_3c);
          }
          else {
            *iVar1._M_current = local_3c;
            (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
        }
      }
      else {
        local_44 = *local_38 + puVar4[uVar3];
        iVar1._M_current =
             (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (v_out,iVar1,&local_44);
        }
        else {
          *iVar1._M_current = local_44;
          (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_44 = 0;
        iVar1._M_current =
             (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (extra_bits,iVar1,&local_44);
        }
        else {
          *iVar1._M_current = 0;
          (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar3 = uVar3 + 1;
      }
LAB_00179b42:
      puVar4 = (v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (long)(v_in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
    } while (uVar3 < uVar7);
  }
  return;
code_r0x00179b7a:
  iVar1._M_current =
       (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)v_out,iVar1,&local_40);
  }
  else {
    *iVar1._M_current = local_40;
    (v_out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_44 = ~(-1 << ((byte)local_40 & 0x1f));
  iVar1._M_current =
       (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (extra_bits,iVar1,&local_44);
  }
  else {
    *iVar1._M_current = local_44;
    (extra_bits->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uVar5 = uVar5 + (-2 << ((byte)local_40 & 0x1f)) + 1;
  if (uVar5 == 0) goto LAB_00179b42;
  goto LAB_00179b6b;
}

Assistant:

void RunLengthCodeZeros(const std::vector<uint32_t>& v_in,
                        uint32_t* max_run_length_prefix,
                        std::vector<uint32_t>* v_out,
                        std::vector<uint32_t>* extra_bits) {
  uint32_t max_reps = 0;
  for (size_t i = 0; i < v_in.size();) {
    for (; i < v_in.size() && v_in[i] != 0; ++i) ;
    uint32_t reps = 0;
    for (; i < v_in.size() && v_in[i] == 0; ++i) {
      ++reps;
    }
    max_reps = std::max(reps, max_reps);
  }
  uint32_t max_prefix = max_reps > 0 ? Log2FloorNonZero(max_reps) : 0;
  max_prefix = std::min(max_prefix, *max_run_length_prefix);
  *max_run_length_prefix = max_prefix;
  for (size_t i = 0; i < v_in.size();) {
    if (v_in[i] != 0) {
      v_out->push_back(v_in[i] + *max_run_length_prefix);
      extra_bits->push_back(0);
      ++i;
    } else {
      uint32_t reps = 1;
      for (size_t k = i + 1; k < v_in.size() && v_in[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      while (reps != 0) {
        if (reps < (2u << max_prefix)) {
          uint32_t run_length_prefix = Log2FloorNonZero(reps);
          v_out->push_back(run_length_prefix);
          extra_bits->push_back(reps - (1u << run_length_prefix));
          break;
        } else {
          v_out->push_back(max_prefix);
          extra_bits->push_back((1u << max_prefix) - 1u);
          reps -= (2u << max_prefix) - 1u;
        }
      }
    }
  }
}